

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Layer_*> *a)

{
  int iVar1;
  byte local_41;
  ON_Object *local_38;
  ON_Object *p;
  int local_28;
  int iStack_24;
  bool rc;
  int count;
  int i;
  ON_Layer *layer;
  ON_SimpleArray<ON_Layer_*> *a_local;
  ON_BinaryArchive *this_local;
  
  layer = (ON_Layer *)a;
  a_local = (ON_SimpleArray<ON_Layer_*> *)this;
  ON_SimpleArray<ON_Layer_*>::Empty(a);
  p._7_1_ = ReadInt(this,&local_28);
  if ((bool)p._7_1_) {
    ON_SimpleArray<ON_Layer_*>::SetCapacity((ON_SimpleArray<ON_Layer_*> *)layer,(long)local_28);
    iStack_24 = 0;
    while( true ) {
      local_41 = 0;
      if (iStack_24 < local_28) {
        local_41 = p._7_1_;
      }
      if ((local_41 & 1) == 0) goto LAB_00494e13;
      _count = (ON_Layer *)0x0;
      local_38 = (ON_Object *)0x0;
      iVar1 = ReadObject(this,&local_38);
      p._7_1_ = iVar1 == 1;
      if ((bool)p._7_1_) {
        _count = ON_Layer::Cast(local_38);
      }
      if (((p._7_1_ & 1) == 0) || (_count == (ON_Layer *)0x0)) break;
      ON_SimpleArray<ON_Layer_*>::Append((ON_SimpleArray<ON_Layer_*> *)layer,(ON_Layer **)&count);
      iStack_24 = iStack_24 + 1;
    }
    if ((local_38 != (ON_Object *)0x0) && (local_38 != (ON_Object *)0x0)) {
      (*local_38->_vptr_ON_Object[4])();
    }
    p._7_1_ = 0;
  }
LAB_00494e13:
  return (bool)(p._7_1_ & 1);
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_SimpleArray<class ON_Layer*>& a)
{
  a.Empty();
  ON_Layer* layer;
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      layer = 0;
      ON_Object* p = 0;
      rc = (1==ReadObject(&p));
      if (rc)
      {
        layer = ON_Layer::Cast(p);
      }
      if (!rc || 0 == layer)
      {
        if ( p )
          delete p;
        rc = false;
        break;
      }
      a.Append(layer);
    }
  }
  return rc;
}